

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O0

void SysPageProtect(void *page,int protect)

{
  int iVar1;
  void *pvVar2;
  byte bVar3;
  long lVar4;
  AddressRange *local_30;
  AddressRange *range;
  size_t size;
  size_t index;
  int protect_local;
  void *page_local;
  
  pvVar2 = pthread_getspecific(tsdKey);
  iVar1 = *(int *)((long)pvVar2 + 0x460);
  *(int *)((long)pvVar2 + 0x460) = iVar1 + 1;
  if (iVar1 == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&mutexRange);
  }
  for (local_30 = ranges;
      (bVar3 = (byte)shiftPage, local_30 != (AddressRange *)0x0 &&
      ((page < local_30->base ||
       ((void *)((long)local_30->base + (local_30->size << (bVar3 & 0x3f))) <= page))));
      local_30 = local_30->next) {
  }
  if (local_30 == (AddressRange *)0x0) {
    for (local_30 = dedicatedRanges;
        (local_30 != (AddressRange *)0x0 &&
        ((page < local_30->base ||
         ((void *)((long)local_30->base + (local_30->size << (bVar3 & 0x3f))) <= page))));
        local_30 = local_30->next) {
    }
    if (local_30 == (AddressRange *)0x0) {
      Col_Error(COL_FATAL,ColibriDomain,2,"Page not found");
    }
    else {
      PlatProtectPages(local_30->base,local_30->size,protect);
      *(byte *)&local_30[1].next = (protect != 0 ^ 0xffU) & 1;
    }
  }
  else {
    size = (long)page - (long)local_30->base >> (bVar3 & 0x3f);
    if ('\0' < *(char *)((long)&local_30[1].next + size)) {
      size = size - (long)*(char *)((long)&local_30[1].next + size);
    }
    PlatProtectPages((void *)((long)local_30->base + (size << (bVar3 & 0x3f))),
                     (long)-(int)*(char *)((long)&local_30[1].next + size),protect);
    if (protect == 0) {
      lVar4 = local_30->size + (size >> 3);
      *(byte *)((long)&local_30[1].next + lVar4) =
           *(byte *)((long)&local_30[1].next + lVar4) | (byte)(1 << ((byte)size & 7));
    }
    else {
      lVar4 = local_30->size + (size >> 3);
      *(byte *)((long)&local_30[1].next + lVar4) =
           *(byte *)((long)&local_30[1].next + lVar4) & ((byte)(1 << ((byte)size & 7)) ^ 0xff);
    }
  }
  pvVar2 = pthread_getspecific(tsdKey);
  iVar1 = *(int *)((long)pvVar2 + 0x460) + -1;
  *(int *)((long)pvVar2 + 0x460) = iVar1;
  if (iVar1 == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&mutexRange);
  }
  return;
}

Assistant:

void
SysPageProtect(
    void * page,    /*!< Page belonging to page group to protect. */
    int protect)    /*!< Whether to protect or unprotect page group. */
{
    size_t index, size;
    AddressRange * range;

    PlatEnterProtectAddressRanges();
    {
        /*
         * Get range info for page.
         */

        range = ranges;
        while (range) {
            if (page >= range->base && (char *) page < (char *) range->base
                    + (range->size << shiftPage)) {
                break;
            }
            range = range->next;
        }
        if (!range) {
            /*
             * Likely dedicated address range.
             */

            range = dedicatedRanges;
            while (range) {
                if (page >= range->base && (char *) page < (char *) range->base
                        + (range->size << shiftPage)) {
                    break;
                }
                range = range->next;
            }
            if (!range) {
                /*
                 * Not found.
                 */

                /*! @fatal{COL_ERROR_MEMORY,Page not found} */
                Col_Error(COL_FATAL, ColibriDomain, COL_ERROR_MEMORY,
                        "Page not found");
                goto end;
            }

            /*
             * Update protection & write tracking flag for whole range.
             */

            PlatProtectPages(range->base, range->size, protect);
            range->allocInfo[0] = !protect;
            goto end;
        }

        index = ((char *) page - (char *) range->base) >> shiftPage;
        ASSERT(range->allocInfo[index] != 0);
        if (range->allocInfo[index] > 0) index -= range->allocInfo[index];
        size = -range->allocInfo[index];
        ASSERT(size > 0);
        ASSERT(index+size <= range->size);

        /*
         * Update protection & write tracking flag for page group (only mark
         * first one in page group).
         */

        PlatProtectPages((char *) range->base + (index << shiftPage), size,
                protect);
        if (protect) {
            range->allocInfo[range->size+(index>>3)] &= ~(1<<(index&7));
        } else {
            range->allocInfo[range->size+(index>>3)] |= (1<<(index&7));
        }
    }
end:
    PlatLeaveProtectAddressRanges();
}